

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O1

void __thiscall
Scene<char>::add<SimpleMesh<SimpleVertex>,SimpleVertex,CharShader,myTexture>
          (Scene<char> *this,
          Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture> *o)

{
  ObjectInfo *info;
  DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>
  *this_00;
  pointer __p;
  CharShader local_61;
  DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>
  *local_60;
  _Head_base<0UL,_DedicatedPipeline<char>_*,_false> local_58;
  vector<bounding_sphere,_std::allocator<bounding_sphere>_> local_50;
  vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_> local_38;
  
  std::vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>::vector
            (&local_38,&o->mesh);
  std::vector<bounding_sphere,_std::allocator<bounding_sphere>_>::vector
            (&local_50,&o->boundingSpheres);
  info = o->info;
  this_00 = (DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>
             *)operator_new(0x68);
  DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>::
  DedicatedPipelineImpl(this_00,&local_38,&local_61,&o->textures,&local_50,info);
  local_60 = (DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>
              *)0x0;
  local_58._M_head_impl = (DedicatedPipeline<char> *)this_00;
  std::
  vector<std::unique_ptr<DedicatedPipeline<char>,std::default_delete<DedicatedPipeline<char>>>,std::allocator<std::unique_ptr<DedicatedPipeline<char>,std::default_delete<DedicatedPipeline<char>>>>>
  ::
  emplace_back<std::unique_ptr<DedicatedPipeline<char>,std::default_delete<DedicatedPipeline<char>>>>
            ((vector<std::unique_ptr<DedicatedPipeline<char>,std::default_delete<DedicatedPipeline<char>>>,std::allocator<std::unique_ptr<DedicatedPipeline<char>,std::default_delete<DedicatedPipeline<char>>>>>
              *)&this->pipelines,
             (unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_> *)
             &local_58);
  if ((DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture> *)
      local_58._M_head_impl !=
      (DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture> *)
      0x0) {
    operator_delete(local_58._M_head_impl,8);
  }
  local_58._M_head_impl = (DedicatedPipeline<char> *)0x0;
  if (local_60 !=
      (DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture> *)
      0x0) {
    std::
    default_delete<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>_>
    ::operator()((default_delete<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>_>
                  *)&local_60,local_60);
  }
  local_60 = (DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>
              *)0x0;
  if (local_50.super__Vector_base<bounding_sphere,_std::allocator<bounding_sphere>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<bounding_sphere,_std::allocator<bounding_sphere>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<bounding_sphere,_std::allocator<bounding_sphere>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<bounding_sphere,_std::allocator<bounding_sphere>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>::~vector
            (&local_38);
  return;
}

Assistant:

void add(const Object<Mesh, Vertex, Shader, Texture...> &o) {
        // Creates the dedicated pipeline for the new object and adds it to the vector
        pipelines.push_back(
                std::make_unique<DedicatedPipelineImpl<target_t, Mesh, Vertex, Shader, Texture...>>(o.getMeshes(),
                                                                                                    o.getShader(),
                                                                                                    o.getTextures(),
                                                                                                    o.getBoundingSpheres(),
                                                                                                    o.getInfo()));
    }